

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::OptConstFoldBranch
          (GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,Value **pDstVal)

{
  bool bVar1;
  Opnd *pOVar2;
  bool local_49;
  Var pvStack_48;
  bool result;
  Var src2Var;
  Var src1Var;
  Value **pDstVal_local;
  Value *src2Val_local;
  Value *src1Val_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if (src1Val == (Value *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    src1Var = pDstVal;
    pDstVal_local = (Value **)src2Val;
    src2Val_local = src1Val;
    src1Val_local = (Value *)instr;
    instr_local = (Instr *)this;
    pOVar2 = IR::Instr::GetSrc1(instr);
    src2Var = GetConstantVar(this,pOVar2,src2Val_local);
    pvStack_48 = (Var)0x0;
    pOVar2 = IR::Instr::GetSrc2((Instr *)src1Val_local);
    if (pOVar2 != (Opnd *)0x0) {
      if (pDstVal_local == (Value **)0x0) {
        return false;
      }
      pOVar2 = IR::Instr::GetSrc2((Instr *)src1Val_local);
      pvStack_48 = GetConstantVar(this,pOVar2,(Value *)pDstVal_local);
    }
    bVar1 = CanProveConditionalBranch
                      (this,(Instr *)src1Val_local,src2Val_local,(Value *)pDstVal_local,src2Var,
                       pvStack_48,&local_49);
    if (bVar1) {
      OptConstFoldBr(this,(bool)(local_49 & 1),(Instr *)src1Val_local,(Value *)0x0,(Value *)0x0);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::OptConstFoldBranch(IR::Instr *instr, Value *src1Val, Value*src2Val, Value **pDstVal)
{
    if (!src1Val)
    {
        return false;
    }

    Js::Var src1Var = this->GetConstantVar(instr->GetSrc1(), src1Val);

    Js::Var src2Var = nullptr;

    if (instr->GetSrc2())
    {
        if (!src2Val)
        {
            return false;
        }

        src2Var = this->GetConstantVar(instr->GetSrc2(), src2Val);
    }

    bool result;

    if (!CanProveConditionalBranch(instr, src1Val, src2Val, src1Var, src2Var, &result))
    {
        return false;
    }


    this->OptConstFoldBr(!!result, instr);

    return true;
}